

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O2

bool __thiscall cmSetPropertyCommand::HandleTestMode(cmSetPropertyCommand *this)

{
  _Rb_tree_header *p_Var1;
  size_t sVar2;
  const_iterator cVar3;
  cmTest *test;
  ostream *poVar4;
  _Base_ptr p_Var5;
  const_iterator __position;
  ostringstream e;
  string local_1c8;
  ostream local_1a8;
  
  p_Var1 = &(this->Names)._M_t._M_impl.super__Rb_tree_header;
  cVar3._M_node = (this->Names)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (__position._M_node = cVar3._M_node, (_Rb_tree_header *)__position._M_node != p_Var1) {
    cVar3._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
    test = cmMakefile::GetTest((this->super_cmCommand).Makefile,(string *)(__position._M_node + 1));
    if (test != (cmTest *)0x0) {
      HandleTest(this,test);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&this->Names,__position);
    }
  }
  sVar2 = (this->Names)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (sVar2 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::operator<<(&local_1a8,"given TEST names that do not exist:\n");
    for (p_Var5 = (this->Names)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != p_Var1; p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      poVar4 = std::operator<<(&local_1a8,"  ");
      poVar4 = std::operator<<(poVar4,(string *)(p_Var5 + 1));
      std::operator<<(poVar4,"\n");
    }
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  }
  return sVar2 == 0;
}

Assistant:

bool cmSetPropertyCommand::HandleTestMode()
{
  // Look for tests with all names given.
  std::set<std::string>::iterator next;
  for (std::set<std::string>::iterator ni = this->Names.begin();
       ni != this->Names.end(); ni = next) {
    next = ni;
    ++next;
    if (cmTest* test = this->Makefile->GetTest(*ni)) {
      if (this->HandleTest(test)) {
        this->Names.erase(ni);
      } else {
        return false;
      }
    }
  }

  // Names that are still left were not found.
  if (!this->Names.empty()) {
    std::ostringstream e;
    e << "given TEST names that do not exist:\n";
    for (std::string const& name : this->Names) {
      e << "  " << name << "\n";
    }
    this->SetError(e.str());
    return false;
  }
  return true;
}